

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

MultipleConcatenationExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::MultipleConcatenationExpressionSyntax,slang::syntax::MultipleConcatenationExpressionSyntax_const&>
          (BumpAllocator *this,MultipleConcatenationExpressionSyntax *args)

{
  undefined4 uVar1;
  MultipleConcatenationExpressionSyntax *pMVar2;
  long lVar3;
  MultipleConcatenationExpressionSyntax *pMVar4;
  byte bVar5;
  
  bVar5 = 0;
  pMVar2 = (MultipleConcatenationExpressionSyntax *)
           ((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((MultipleConcatenationExpressionSyntax *)this->endPtr < pMVar2 + 1) {
    pMVar2 = (MultipleConcatenationExpressionSyntax *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pMVar2 + 1);
  }
  pMVar4 = pMVar2;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)
             &(args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.
              field_0x4;
    (pMVar4->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind =
         (args->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind;
    *(undefined4 *)
     &(pMVar4->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.field_0x4 =
         uVar1;
    args = (MultipleConcatenationExpressionSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pMVar4 = (MultipleConcatenationExpressionSyntax *)((long)pMVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pMVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }